

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O2

int __thiscall QTextCopyHelper::copy(QTextCopyHelper *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QTextCursor *this_00;
  QTextDocumentPrivate *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int extraout_EAX;
  QTextTable *this_01;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  int local_a8;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  QTextFormat local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->cursor;
  bVar2 = QTextCursor::hasComplexSelection(this_00);
  if (bVar2) {
    this_01 = QTextCursor::currentTable(this_00);
    row_start = -0x55555556;
    col_start = -0x55555556;
    num_rows = -0x55555556;
    num_cols = -0x55555556;
    QTextCursor::selectedTableCells(this_00,&row_start,&num_rows,&col_start,&num_cols);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextTable::format((QTextTable *)local_48);
    QTextTableFormat::setColumns((QTextTableFormat *)local_48,num_cols);
    QTextTableFormat::clearColumnWidthConstraints((QTextTableFormat *)local_48);
    iVar3 = QTextFormatCollection::createObjectIndex(&this->dst->formats,(QTextFormat *)local_48);
    for (iVar9 = row_start; iVar9 < row_start + num_rows; iVar9 = iVar9 + 1) {
      local_a8 = -col_start;
      for (iVar10 = col_start; iVar10 < col_start + num_cols; iVar10 = iVar10 + 1) {
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextTable::cellAt((QTextTable *)local_58,(int)this_01,iVar9);
        iVar4 = QTextTableCell::rowSpan((QTextTableCell *)local_58);
        iVar5 = QTextTableCell::columnSpan((QTextTableCell *)local_58);
        if (iVar4 == 1) {
LAB_004679d5:
          if (iVar5 != 1) {
            iVar6 = QTextTableCell::column((QTextTableCell *)local_58);
            if (iVar10 != iVar6) goto LAB_00467b22;
          }
          local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextTableCell::format((QTextTableCell *)local_68);
          if (num_rows + row_start <= iVar4 + iVar9) {
            QTextCharFormat::setTableCellRowSpan
                      ((QTextCharFormat *)local_68,(num_rows + row_start) - iVar9);
          }
          if (num_cols + col_start <= iVar5 + iVar10) {
            QTextCharFormat::setTableCellColumnSpan
                      ((QTextCharFormat *)local_68,num_cols + col_start + local_a8);
          }
          iVar5 = convertFormatIndex(this,(QTextFormat *)local_68,iVar3);
          iVar6 = QTextTableCell::firstPosition((QTextTableCell *)local_58);
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = this->src;
          uVar7 = QFragmentMapData<QTextBlockData>::findNode(&(pQVar1->blocks).data,iVar6,0);
          local_78._8_4_ = uVar7;
          local_78._0_8_ = pQVar1;
          iVar8 = QTextBlock::position((QTextBlock *)local_78);
          iVar4 = -2;
          if (iVar8 == iVar6) {
            QTextBlock::blockFormat((QTextBlock *)&local_88);
            iVar4 = convertFormatIndex(this,&local_88,-1);
            QTextFormat::~QTextFormat(&local_88);
          }
          QTextDocumentPrivate::insertBlock
                    (this->dst,(QChar)0xfdd0,this->insertPos,iVar4,iVar5,MoveCursor);
          this->insertPos = this->insertPos + 1;
          iVar4 = QTextTableCell::lastPosition((QTextTableCell *)local_58);
          if (iVar6 < iVar4) {
            iVar4 = QTextTableCell::lastPosition((QTextTableCell *)local_58);
            appendFragments(this,iVar6,iVar4);
          }
          QTextFormat::~QTextFormat((QTextFormat *)local_68);
        }
        else {
          iVar6 = QTextTableCell::row((QTextTableCell *)local_58);
          if (iVar6 == iVar9) goto LAB_004679d5;
        }
LAB_00467b22:
        local_a8 = local_a8 + -1;
      }
    }
    iVar9 = QTextFrame::lastPosition(&this_01->super_QTextFrame);
    appendFragment(this,iVar9,iVar9 + 1,iVar3);
    QTextFormat::~QTextFormat((QTextFormat *)local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    iVar9 = QTextCursor::selectionStart(this_00);
    iVar3 = QTextCursor::selectionEnd(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      appendFragments(this,iVar9,iVar3);
      return extraout_EAX;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QTextCopyHelper::copy()
{
    if (cursor.hasComplexSelection()) {
        QTextTable *table = cursor.currentTable();
        int row_start, col_start, num_rows, num_cols;
        cursor.selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

        QTextTableFormat tableFormat = table->format();
        tableFormat.setColumns(num_cols);
        tableFormat.clearColumnWidthConstraints();
        const int objectIndex = dst->formatCollection()->createObjectIndex(tableFormat);

        Q_ASSERT(row_start != -1);
        for (int r = row_start; r < row_start + num_rows; ++r) {
            for (int c = col_start; c < col_start + num_cols; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                const int rspan = cell.rowSpan();
                const int cspan = cell.columnSpan();
                if (rspan != 1) {
                    int cr = cell.row();
                    if (cr != r)
                        continue;
                }
                if (cspan != 1) {
                    int cc = cell.column();
                    if (cc != c)
                        continue;
                }

                // add the QTextBeginningOfFrame
                QTextCharFormat cellFormat = cell.format();
                if (r + rspan >= row_start + num_rows) {
                    cellFormat.setTableCellRowSpan(row_start + num_rows - r);
                }
                if (c + cspan >= col_start + num_cols) {
                    cellFormat.setTableCellColumnSpan(col_start + num_cols - c);
                }
                const int charFormatIndex = convertFormatIndex(cellFormat, objectIndex);

                int blockIdx = -2;
                const int cellPos = cell.firstPosition();
                QTextBlock block = src->blocksFind(cellPos);
                if (block.position() == cellPos) {
                    blockIdx = convertFormatIndex(block.blockFormat());
                }

                dst->insertBlock(QTextBeginningOfFrame, insertPos, blockIdx, charFormatIndex);
                ++insertPos;

                // nothing to add for empty cells
                if (cell.lastPosition() > cellPos) {
                    // add the contents
                    appendFragments(cellPos, cell.lastPosition());
                }
            }
        }

        // add end of table
        int end = table->lastPosition();
        appendFragment(end, end+1, objectIndex);
    } else {
        appendFragments(cursor.selectionStart(), cursor.selectionEnd());
    }
}